

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

uint8 * __thiscall
sentencepiece::ModelProto::_InternalSerialize
          (ModelProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  TrainerSpec *this_00;
  NormalizerSpec *pNVar3;
  SelfTestData *this_01;
  void *pvVar4;
  uint8 *puVar5;
  Type *this_02;
  ulong uVar6;
  int index;
  
  iVar1 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                        (&(this->pieces_).super_RepeatedPtrFieldBase,index);
    *puVar5 = '\n';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_02->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = ModelProto_SentencePiece::_InternalSerialize(this_02,puVar5,stream);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = this->trainer_spec_;
    *puVar5 = '\x12';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = TrainerSpec::_InternalSerialize(this_00,puVar5,stream);
  }
  if ((uVar2 & 2) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pNVar3 = this->normalizer_spec_;
    *puVar5 = '\x1a';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((pNVar3->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = NormalizerSpec::_InternalSerialize(pNVar3,puVar5,stream);
  }
  if ((uVar2 & 4) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_01 = this->self_test_data_;
    *puVar5 = '\"';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = SelfTestData::_InternalSerialize(this_01,puVar5,stream);
  }
  if ((uVar2 & 8) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pNVar3 = this->denormalizer_spec_;
    *puVar5 = '*';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((pNVar3->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = NormalizerSpec::_InternalSerialize(pNVar3,puVar5,stream);
  }
  puVar5 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return puVar5;
  }
  uVar6 = (ulong)pvVar4 & 0xfffffffffffffffe;
  puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar6 + 8),*(int *)(uVar6 + 0x10),puVar5);
  return puVar5;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_pieces(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional .sentencepiece.TrainerSpec trainer_spec = 2;
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::trainer_spec(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::normalizer_spec(this), target, stream);
  }

  // optional .sentencepiece.SelfTestData self_test_data = 4;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::self_test_data(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::denormalizer_spec(this), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto)
  return target;
}